

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O0

DWARFFormValue *
llvm::DWARFFormValue::createFromUnit
          (DWARFFormValue *__return_storage_ptr__,Form F,DWARFUnit *U,uint64_t *OffsetPtr)

{
  uint64_t *OffsetPtr_00;
  FormParams *pFVar1;
  DWARFFormValue *FormValue;
  DWARFDataExtractor local_48;
  uint64_t *local_20;
  uint64_t *OffsetPtr_local;
  DWARFUnit *U_local;
  Form F_local;
  
  local_20 = OffsetPtr;
  OffsetPtr_local = (uint64_t *)U;
  U_local._6_2_ = F;
  DWARFFormValue(__return_storage_ptr__,F);
  DWARFUnit::getDebugInfoExtractor(&local_48,(DWARFUnit *)OffsetPtr_local);
  OffsetPtr_00 = local_20;
  pFVar1 = DWARFUnit::getFormParams((DWARFUnit *)OffsetPtr_local);
  extractValue(__return_storage_ptr__,&local_48,OffsetPtr_00,*pFVar1,(DWARFUnit *)OffsetPtr_local);
  return __return_storage_ptr__;
}

Assistant:

DWARFFormValue DWARFFormValue::createFromUnit(dwarf::Form F, const DWARFUnit *U,
                                              uint64_t *OffsetPtr) {
  DWARFFormValue FormValue(F);
  FormValue.extractValue(U->getDebugInfoExtractor(), OffsetPtr,
                         U->getFormParams(), U);
  return FormValue;
}